

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniply-info.cpp
# Opt level: O3

bool print_ply_header(char *filename)

{
  int iVar1;
  pointer pPVar2;
  bool bVar3;
  bool bVar4;
  PLYFileType PVar5;
  uint uVar6;
  uint uVar7;
  uint32_t uVar8;
  PLYElement *pPVar9;
  pointer puVar10;
  uint32_t idx;
  PLYProperty *prop_1;
  pointer pPVar11;
  PLYProperty *prop;
  PLYReader reader;
  PLYReader local_c0;
  
  miniply::PLYReader::PLYReader(&local_c0,filename);
  bVar3 = miniply::PLYReader::valid(&local_c0);
  if (bVar3) {
    puts("ply");
    PVar5 = miniply::PLYReader::file_type(&local_c0);
    iVar1 = *(int *)(_ZL10kFileTypes_rel + (long)(int)PVar5 * 4);
    uVar6 = miniply::PLYReader::version_major(&local_c0);
    uVar7 = miniply::PLYReader::version_minor(&local_c0);
    printf("format %s %d.%d\n",_ZL10kFileTypes_rel + iVar1,(ulong)uVar6,(ulong)uVar7);
    uVar8 = miniply::PLYReader::num_elements(&local_c0);
    if (uVar8 != 0) {
      idx = 0;
      do {
        pPVar9 = miniply::PLYReader::get_element(&local_c0,idx);
        printf("element %s %u\n",(pPVar9->name)._M_dataplus._M_p,(ulong)pPVar9->count);
        pPVar2 = (pPVar9->properties).
                 super__Vector_base<miniply::PLYProperty,_std::allocator<miniply::PLYProperty>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        for (pPVar11 = (pPVar9->properties).
                       super__Vector_base<miniply::PLYProperty,_std::allocator<miniply::PLYProperty>_>
                       ._M_impl.super__Vector_impl_data._M_start; pPVar11 != pPVar2;
            pPVar11 = pPVar11 + 1) {
          if ((ulong)pPVar11->countType == 8) {
            printf("property %s %s\n",kPropertyTypes[pPVar11->type],(pPVar11->name)._M_dataplus._M_p
                  );
          }
          else {
            printf("property list %s %s %s\n",kPropertyTypes[pPVar11->countType],
                   kPropertyTypes[pPVar11->type],(pPVar11->name)._M_dataplus._M_p);
          }
        }
        idx = idx + 1;
      } while (idx != uVar8);
    }
    puts("end_header");
    while( true ) {
      bVar4 = miniply::PLYReader::has_element(&local_c0);
      if (!bVar4) break;
      pPVar9 = miniply::PLYReader::element(&local_c0);
      if ((pPVar9->fixedSize == false) && (pPVar9->count != 0)) {
        bVar4 = miniply::PLYReader::load_element(&local_c0);
        if (!bVar4) {
          print_ply_header();
        }
        pPVar2 = (pPVar9->properties).
                 super__Vector_base<miniply::PLYProperty,_std::allocator<miniply::PLYProperty>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        for (pPVar11 = (pPVar9->properties).
                       super__Vector_base<miniply::PLYProperty,_std::allocator<miniply::PLYProperty>_>
                       ._M_impl.super__Vector_impl_data._M_start; pPVar11 != pPVar2;
            pPVar11 = pPVar11 + 1) {
          if (pPVar11->countType != None) {
            puVar10 = (pPVar11->rowCount).
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start;
            uVar6 = *puVar10;
            for (; puVar10 !=
                   (pPVar11->rowCount).
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish; puVar10 = puVar10 + 1) {
              if (*puVar10 != uVar6) {
                printf("Element \'%s\', list property \'%s\': not all lists have the same size\n",
                       (pPVar9->name)._M_dataplus._M_p,(pPVar11->name)._M_dataplus._M_p);
                goto LAB_00108081;
              }
            }
            printf("Element \'%s\', list property \'%s\': all lists have size %u\n",
                   (pPVar9->name)._M_dataplus._M_p,(pPVar11->name)._M_dataplus._M_p);
          }
LAB_00108081:
        }
      }
      miniply::PLYReader::next_element(&local_c0);
    }
  }
  else {
    fprintf(_stderr,"Failed to open %s\n",filename);
  }
  miniply::PLYReader::~PLYReader(&local_c0);
  return bVar3;
}

Assistant:

bool print_ply_header(const char* filename)
{
  miniply::PLYReader reader(filename);
  if (!reader.valid()) {
    fprintf(stderr, "Failed to open %s\n", filename);
    return false;
  }

  printf("ply\n");
  printf("format %s %d.%d\n", kFileTypes[int(reader.file_type())], reader.version_major(), reader.version_minor());
  for (uint32_t i = 0, endI = reader.num_elements(); i < endI; i++) {
    const miniply::PLYElement* elem = reader.get_element(i);
    printf("element %s %u\n", elem->name.c_str(), elem->count);
    for (const miniply::PLYProperty& prop : elem->properties) {
      if (prop.countType != miniply::PLYPropertyType::None) {
        printf("property list %s %s %s\n", kPropertyTypes[uint32_t(prop.countType)], kPropertyTypes[uint32_t(prop.type)], prop.name.c_str());
      }
      else {
        printf("property %s %s\n", kPropertyTypes[uint32_t(prop.type)], prop.name.c_str());
      }
    }
  }
  printf("end_header\n");

  while (reader.has_element()) {
    const miniply::PLYElement* elem = reader.element();
    if (elem->fixedSize || elem->count == 0) {
      reader.next_element();
      continue;
    }

    if (!reader.load_element()) {
      fprintf(stderr, "Element %s failed to load\n", elem->name.c_str());
    }
    for (const miniply::PLYProperty& prop : elem->properties) {
      if (prop.countType == miniply::PLYPropertyType::None) {
        continue;
      }
      bool mixedSize = false;
      const uint32_t firstRowCount = prop.rowCount.front();
      for (const uint32_t rowCount : prop.rowCount) {
        if (rowCount != firstRowCount) {
          mixedSize = true;
          break;
        }
      }
      if (mixedSize) {
        printf("Element '%s', list property '%s': not all lists have the same size\n",
               elem->name.c_str(), prop.name.c_str());
      }
      else {
        printf("Element '%s', list property '%s': all lists have size %u\n",
               elem->name.c_str(), prop.name.c_str(), firstRowCount);
      }
    }
    reader.next_element();
  }

  return true;
}